

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

void js_std_loop(JSContext *ctx)

{
  int iVar1;
  JSContext *in_RAX;
  JSRuntime *rt;
  JSContext *ctx1;
  JSContext *local_18;
  
  local_18 = in_RAX;
  while( true ) {
    do {
      rt = JS_GetRuntime(ctx);
      iVar1 = JS_ExecutePendingJob(rt,&local_18);
    } while (0 < iVar1);
    if (iVar1 < 0) {
      js_std_dump_error(local_18);
    }
    if (os_poll_func == (_func_int_JSContext_ptr *)0x0) break;
    iVar1 = js_os_poll(ctx);
    if (iVar1 != 0) {
      return;
    }
  }
  return;
}

Assistant:

void js_std_loop(JSContext *ctx)
{
    JSContext *ctx1;
    int err;

    for(;;) {
        /* execute the pending jobs */
        for(;;) {
            err = JS_ExecutePendingJob(JS_GetRuntime(ctx), &ctx1);
            if (err <= 0) {
                if (err < 0) {
                    js_std_dump_error(ctx1);
                }
                break;
            }
        }

        if (!os_poll_func || os_poll_func(ctx))
            break;
    }
}